

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O0

void __thiscall Clasp::Cli::TextOutput::printSummary(TextOutput *this,Summary *run,bool final)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  char *pcVar4;
  uint64 uVar5;
  UPair UVar6;
  SumVec *pSVar7;
  SharedContext *pSVar8;
  char *pcVar9;
  byte in_DL;
  Summary *in_RSI;
  TextOutput *in_RDI;
  char *moreStr;
  char *res;
  Summary *in_stack_ffffffffffffff28;
  Summary *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint uVar10;
  Summary *in_stack_ffffffffffffff40;
  SumVec *in_stack_ffffffffffffff48;
  TextOutput *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  SumVec *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  pod_vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  Model *in_stack_ffffffffffffff88;
  OutputTable *in_stack_ffffffffffffff90;
  Summary *in_stack_ffffffffffffffa8;
  OutputTable *local_20;
  
  if (((in_DL & 1) != 0) && (iVar2 = Output::callQ(&in_RDI->super_Output), iVar2 != 2)) {
    comment(in_RDI,1,"%s\n",
            "====================================== Accumulation ======================================|"
           );
  }
  local_20 = (OutputTable *)in_RDI->result[0];
  bVar1 = ClaspFacade::Summary::unsat((Summary *)0x1561e5);
  if (bVar1) {
    local_20 = (OutputTable *)in_RDI->result[2];
  }
  else {
    bVar1 = ClaspFacade::Summary::sat((Summary *)0x15620b);
    if (bVar1) {
      bVar1 = ClaspFacade::Summary::optimum(in_stack_ffffffffffffff40);
      if (bVar1) {
        in_stack_ffffffffffffff90 = (OutputTable *)in_RDI->result[3];
        local_20 = in_stack_ffffffffffffff90;
      }
      else {
        in_stack_ffffffffffffff90 = (OutputTable *)in_RDI->result[1];
        local_20 = in_stack_ffffffffffffff90;
      }
    }
  }
  if (*(char *)&local_20->theory != '\0') {
    printf("%s%s\n",in_RDI->format[3],local_20);
  }
  uVar3 = Output::verbosity(&in_RDI->super_Output);
  if ((uVar3 != 0) ||
     (bVar1 = Output::stats((Output *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28), bVar1))
  {
    printf("%s\n",in_RDI->format[0]);
    bVar1 = SolveResult::interrupted(&in_RSI->result);
    if (bVar1) {
      pcVar9 = "TIME LIMIT";
      if ((in_RSI->result).signal != '\x0e') {
        pcVar9 = "INTERRUPTED";
      }
      printf("%s%-*s: %u\n",in_RDI->format[0],(ulong)(uint)in_RDI->width_,pcVar9,1);
    }
    bVar1 = ClaspFacade::Summary::complete((Summary *)0x156324);
    pcVar9 = "+";
    if (bVar1) {
      pcVar9 = "";
    }
    printf("%s%-*s: ",in_RDI->format[0],(ulong)(uint)in_RDI->width_,"Models");
    printf("%lu%s\n",in_RSI->numEnum,pcVar9);
    bVar1 = ClaspFacade::Summary::sat((Summary *)0x156398);
    if (bVar1) {
      pcVar4 = ClaspFacade::Summary::consequences(in_stack_ffffffffffffff30);
      if (pcVar4 != (char *)0x0) {
        in_stack_ffffffffffffff78 = (pod_vector<long,_std::allocator<long>_> *)in_RDI->format[0];
        in_stack_ffffffffffffff84 = in_RDI->width_ - 2;
        in_stack_ffffffffffffff88 =
             (Model *)ClaspFacade::Summary::consequences(in_stack_ffffffffffffff30);
        bVar1 = ClaspFacade::Summary::complete((Summary *)0x1563ee);
        pcVar4 = "unknown";
        if (bVar1) {
          pcVar4 = "yes";
        }
        printf("%s  %-*s: %s\n",in_stack_ffffffffffffff78,(ulong)in_stack_ffffffffffffff84,
               in_stack_ffffffffffffff88,pcVar4);
      }
      pSVar7 = ClaspFacade::Summary::costs(in_stack_ffffffffffffff30);
      if (pSVar7 != (SumVec *)0x0) {
        in_stack_ffffffffffffff68 = (SumVec *)in_RDI->format[0];
        in_stack_ffffffffffffff74 = in_RDI->width_;
        bVar1 = ClaspFacade::Summary::optimum(in_stack_ffffffffffffff40);
        pcVar4 = "unknown";
        if (bVar1) {
          pcVar4 = "yes";
        }
        printf("%s%-*s: %s\n",in_stack_ffffffffffffff68,(ulong)in_stack_ffffffffffffff74,"  Optimum"
               ,pcVar4);
      }
      bVar1 = ClaspFacade::Summary::optimize
                        ((Summary *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (bVar1) {
        uVar5 = ClaspFacade::Summary::optimal(in_RSI);
        if (1 < uVar5) {
          pcVar4 = in_RDI->format[0];
          in_stack_ffffffffffffff64 = in_RDI->width_;
          uVar5 = ClaspFacade::Summary::optimal(in_RSI);
          printf("%s%-*s: %lu\n",pcVar4,(ulong)in_stack_ffffffffffffff64,"  Optimal",uVar5);
        }
        printf("%s%-*s: ",in_RDI->format[0],(ulong)(uint)in_RDI->width_,"Optimization");
        ClaspFacade::Summary::costs(in_stack_ffffffffffffff30);
        printCostsImpl(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                       (char)((ulong)in_stack_ffffffffffffff40 >> 0x38),
                       (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        printf("\n");
      }
      pcVar4 = ClaspFacade::Summary::consequences(in_stack_ffffffffffffff30);
      if (pcVar4 != (char *)0x0) {
        printf("%s%-*s: ",in_RDI->format[0],(ulong)(uint)in_RDI->width_,"Consequences");
        pSVar8 = ClaspFacade::Summary::ctx(in_RSI);
        in_stack_ffffffffffffff50 = (TextOutput *)&pSVar8->output;
        ClaspFacade::Summary::model(in_stack_ffffffffffffff30);
        UVar6 = Output::numCons(&in_RDI->super_Output,in_stack_ffffffffffffff90,
                                in_stack_ffffffffffffff88);
        printf("%u%s\n",(ulong)UVar6 & 0xffffffff,pcVar9);
      }
    }
    bVar1 = ClaspFacade::Summary::hasLower(in_stack_ffffffffffffff40);
    if ((bVar1) && (bVar1 = ClaspFacade::Summary::optimum(in_stack_ffffffffffffff40), !bVar1)) {
      printf("%s%-*s: ",in_RDI->format[0],(ulong)(uint)in_RDI->width_,"Bounds");
      ClaspFacade::Summary::lower(in_stack_ffffffffffffffa8);
      pSVar7 = ClaspFacade::Summary::costs(in_stack_ffffffffffffff30);
      if (pSVar7 == (SumVec *)0x0) {
        bk_lib::pod_vector<long,_std::allocator<long>_>::pod_vector
                  ((pod_vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff50);
      }
      else {
        ClaspFacade::Summary::costs(in_stack_ffffffffffffff30);
        bk_lib::pod_vector<long,_std::allocator<long>_>::pod_vector
                  ((pod_vector<long,_std::allocator<long>_> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
      }
      printBounds((TextOutput *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                  in_stack_ffffffffffffff68,
                  (SumVec *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      bk_lib::pod_vector<long,_std::allocator<long>_>::~pod_vector
                ((pod_vector<long,_std::allocator<long>_> *)0x1566d1);
      bk_lib::pod_vector<long,_std::allocator<long>_>::~pod_vector
                ((pod_vector<long,_std::allocator<long>_> *)0x1566de);
      printf("\n");
    }
    if ((in_DL & 1) != 0) {
      printf("%s%-*s: %u\n",in_RDI->format[0],(ulong)(uint)in_RDI->width_,"Calls",
             (ulong)(in_RSI->step + 1));
    }
    printf("%s%-*s: ",in_RDI->format[0],(ulong)(uint)in_RDI->width_,"Time");
    printf("%.3fs (Solving: %.2fs 1st Model: %.2fs Unsat: %.2fs)\n",in_RSI->totalTime,
           in_RSI->solveTime,in_RSI->satTime,in_RSI->unsatTime);
    printf("%s%-*s: %.3fs\n",in_RSI->cpuTime,in_RDI->format[0],(ulong)(uint)in_RDI->width_,
           "CPU Time");
    pSVar8 = ClaspFacade::Summary::ctx(in_RSI);
    uVar3 = SharedContext::concurrency(pSVar8);
    if (1 < uVar3) {
      pcVar9 = in_RDI->format[0];
      uVar10 = in_RDI->width_;
      pSVar8 = ClaspFacade::Summary::ctx(in_RSI);
      uVar3 = SharedContext::concurrency(pSVar8);
      printf("%s%-*s: %-8u",pcVar9,(ulong)uVar10,"Threads",(ulong)uVar3);
      pSVar8 = ClaspFacade::Summary::ctx(in_RSI);
      uVar3 = SharedContext::winner(pSVar8);
      printf(" (Winner: %u)\n",(ulong)uVar3);
    }
  }
  return;
}

Assistant:

void TextOutput::printSummary(const ClaspFacade::Summary& run, bool final) {
	if (final && callQ() != print_no){
		comment(1, "%s\n", finalSep);
	}
	const char* res = result[res_unknown];
	if      (run.unsat()) { res = result[res_unsat]; }
	else if (run.sat())   { res = !run.optimum() ? result[res_sat] : result[res_opt]; }
	if (*res) { printLN(cat_result, "%s", res); }
	if (verbosity() || stats(run)) {
		printBR(cat_comment);
		if (run.result.interrupted()){ printKeyValue((run.result.signal != SIGALRM ? "INTERRUPTED" : "TIME LIMIT"), "%u\n", uint32(1));  }
		const char* const moreStr = run.complete() ? "" :  "+";
		printKey("Models");
		printf("%" PRIu64 "%s\n", run.numEnum, moreStr);
		if (run.sat()) {
			if (run.consequences()) { printLN(cat_comment, "  %-*s: %s", width_-2, run.consequences(), (run.complete()?"yes":"unknown")); }
			if (run.costs())        { printKeyValue("  Optimum", "%s\n", run.optimum()?"yes":"unknown"); }
			if (run.optimize())     {
				if (run.optimal() > 1){ printKeyValue("  Optimal", "%" PRIu64"\n", run.optimal()); }
				printKey("Optimization");
				printCostsImpl(*run.costs(), ' ');
				printf("\n");
			}
			if (run.consequences()) {
				printKey("Consequences");
				printf("%u%s\n", numCons(run.ctx().output, *run.model()).first, moreStr);
			}
		}
		if (run.hasLower() && !run.optimum()) {
			printKey("Bounds");
			printBounds(run.lower(), run.costs() ? *run.costs() : SumVec());
			printf("\n");
		}
		if (final) { printKeyValue("Calls", "%u\n", run.step + 1); }
		printKey("Time");
		printf("%.3fs (Solving: %.2fs 1st Model: %.2fs Unsat: %.2fs)\n"
			, run.totalTime
			, run.solveTime
			, run.satTime
			, run.unsatTime);
		printKeyValue("CPU Time", "%.3fs\n", run.cpuTime);
		if (run.ctx().concurrency() > 1) {
			printKeyValue("Threads", "%-8u", run.ctx().concurrency());
			printf(" (Winner: %u)\n", run.ctx().winner());
		}
	}
}